

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

void r8poly_print(int n,double *a,string *title)

{
  _Setw _Var1;
  long lVar2;
  ostream *poVar3;
  double dVar4;
  char local_31;
  char plus_minus;
  double mag;
  int i;
  string *title_local;
  double *a_local;
  int n_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::operator<<((ostream *)&std::cout,"\n");
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)title);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  if (n < 0) {
    std::operator<<((ostream *)&std::cout,"  p(x) = 0\n");
  }
  else {
    if (0.0 < a[n] || a[n] == 0.0) {
      local_31 = ' ';
    }
    else {
      local_31 = '-';
    }
    dVar4 = ABS(a[n]);
    if (n < 2) {
      if (n == 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"  p(x) = ");
        poVar3 = std::operator<<(poVar3,local_31);
        _Var1 = std::setw(0xe);
        poVar3 = std::operator<<(poVar3,_Var1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
        std::operator<<(poVar3," * x\n");
      }
      else if (n == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"  p(x) = ");
        poVar3 = std::operator<<(poVar3,local_31);
        _Var1 = std::setw(0xe);
        poVar3 = std::operator<<(poVar3,_Var1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
        std::operator<<(poVar3,"\n");
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"  p(x) = ");
      poVar3 = std::operator<<(poVar3,local_31);
      _Var1 = std::setw(0xe);
      poVar3 = std::operator<<(poVar3,_Var1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
      poVar3 = std::operator<<(poVar3," * x ^ ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
      std::operator<<(poVar3,"\n");
    }
    for (mag._4_4_ = n + -1; -1 < mag._4_4_; mag._4_4_ = mag._4_4_ + -1) {
      if (0.0 < a[mag._4_4_] || a[mag._4_4_] == 0.0) {
        local_31 = '+';
      }
      else {
        local_31 = '-';
      }
      dVar4 = ABS(a[mag._4_4_]);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        if (mag._4_4_ < 2) {
          if (mag._4_4_ == 1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"         ");
            poVar3 = std::operator<<(poVar3,local_31);
            _Var1 = std::setw(0xe);
            poVar3 = std::operator<<(poVar3,_Var1);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
            std::operator<<(poVar3," * x\n");
          }
          else if (mag._4_4_ == 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,"         ");
            poVar3 = std::operator<<(poVar3,local_31);
            _Var1 = std::setw(0xe);
            poVar3 = std::operator<<(poVar3,_Var1);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
            std::operator<<(poVar3,"\n");
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"         ");
          poVar3 = std::operator<<(poVar3,local_31);
          _Var1 = std::setw(0xe);
          poVar3 = std::operator<<(poVar3,_Var1);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar4);
          poVar3 = std::operator<<(poVar3," * x ^ ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,mag._4_4_);
          std::operator<<(poVar3,"\n");
        }
      }
    }
  }
  return;
}

Assistant:

void r8poly_print ( int n, double a[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    R8POLY_PRINT prints out a polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the dimension of A.
//
//    Input, double A[N+1], the polynomial coefficients.
//    A(0) is the constant term and
//    A(N) is the coefficient of X^N.
//
//    Input, string TITLE, a title.
//
{
  int i;
  double mag;
  char plus_minus;

  if ( 0 < title.length ( ) )
  {
    std::cout << "\n";
    std::cout << title << "\n";
  }
  std::cout << "\n";

  if ( n < 0 )
  {
    std::cout << "  p(x) = 0\n";
    return;
  }

  if ( a[n] < 0.0 )
  {
    plus_minus = '-';
  }
  else
  {
    plus_minus = ' ';
  }

  mag = fabs ( a[n] );

  if ( 2 <= n )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x ^ " << n << "\n";
  }
  else if ( n == 1 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x\n";
  }
  else if ( n == 0 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << "\n";
  }

  for ( i = n - 1; 0 <= i; i-- )
  {
    if ( a[i] < 0.0 )
    {
      plus_minus = '-';
    }
    else
    {
      plus_minus = '+';
    }

    mag = fabs ( a[i] );

    if ( mag != 0.0 )
    {
      if ( 2 <= i )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x ^ " << i << "\n";
      }
      else if ( i == 1 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x\n";
      }
      else if ( i == 0 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << "\n";
      }
    }
  }

  return;
}